

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::createLoopContinue(Builder *this)

{
  reference pvVar1;
  Builder *this_local;
  
  pvVar1 = std::
           stack<spv::Builder::LoopBlocks,_std::deque<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>_>
           ::top(&this->loops);
  createBranch(this,false,pvVar1->continue_target);
  createAndSetNoPredecessorBlock(this,"post-loop-continue");
  return;
}

Assistant:

void Builder::createLoopContinue()
{
    createBranch(false, &loops.top().continue_target);
    // Set up a block for dead code.
    createAndSetNoPredecessorBlock("post-loop-continue");
}